

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O1

void __thiscall
ON_ClassId::ConstructorHelper(ON_ClassId *this,char *sClassName,char *sBaseClassName,char *sUUID)

{
  bool bVar1;
  int iVar2;
  ON_ClassId *pOVar3;
  ulong uVar4;
  uint uVar5;
  char *pcVar6;
  undefined1 uVar7;
  uint uVar8;
  ON_ClassId **ppOVar9;
  ON_UUID OVar10;
  char s [7];
  undefined7 in_stack_ffffffffffffffb8;
  uchar in_stack_ffffffffffffffbf;
  undefined1 auStack_40 [6];
  undefined8 local_3a;
  undefined2 local_32;
  
  pcVar6 = this->m_sClassName;
  memset(pcVar6,0,0xa0);
  OVar10 = ON_UuidFromString(sUUID);
  this->m_uuid = OVar10;
  if (sClassName != (char *)0x0) {
    strncpy(pcVar6,sClassName,0x4f);
  }
  if (sBaseClassName != (char *)0x0) {
    strncpy(this->m_sBaseClassName,sBaseClassName,0x4f);
  }
  pOVar3 = ClassId(this->m_sBaseClassName);
  this->m_pBaseClassId = pOVar3;
  if (this->m_sClassName[0] == '\0') {
    pcVar6 = "ON_ClassId::ON_ClassId() - missing class name";
    iVar2 = 0x2e2;
  }
  else {
    pOVar3 = ClassId(pcVar6);
    if ((pOVar3 != (ON_ClassId *)0x0) && (2 < m_mark0)) {
      ON_WarningEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_object.cpp"
                   ,0x2ee,"",
                   "ON_ClassId::ON_ClassId() - class name already in use.  Will append number to make it unique."
                  );
      uVar8 = 1;
      do {
        local_3a = 0x3736353433323130;
        local_32 = 0x3938;
        uVar4 = 6;
        uVar5 = uVar8;
        do {
          if ((int)uVar5 % 10 < 0) {
            uVar7 = 0x2d;
          }
          else {
            uVar7 = *(undefined1 *)((long)&local_3a + (ulong)(uint)((int)uVar5 % 10));
          }
          (&stack0xffffffffffffffbe)[uVar4] = uVar7;
          uVar4 = uVar4 - 1;
          uVar5 = (int)uVar5 / 10;
        } while (1 < uVar4);
        in_stack_ffffffffffffffbf = '-';
        strncpy(pcVar6,sClassName,0x4f);
        strncat(pcVar6,&stack0xffffffffffffffbf,0x4f);
        pOVar3 = ClassId(pcVar6);
      } while ((uVar8 < 9999) && (uVar8 = uVar8 + 1, pOVar3 != (ON_ClassId *)0x0));
    }
    if (pOVar3 == (ON_ClassId *)0x0) {
      if ((((this->m_sClassName[8] == 't' && this->m_sClassName[7] == 'c') &&
           ((this->m_sClassName[6] == 'e' &&
            (this->m_sClassName[5] == 'j' && this->m_sClassName[4] == 'b')) &&
           ((this->m_sClassName[3] == 'O' && this->m_sClassName[2] == '_') &&
           (this->m_sClassName[1] == 'N' && this->m_sClassName[0] == 'O')))) &&
           this->m_sClassName[9] == '\0') || (this->m_sBaseClassName[0] != '\0')) {
        g_bDisableDemotion = 1;
        OVar10.Data4[0] = (char)in_stack_ffffffffffffffb8;
        OVar10.Data4[1] = (char)((uint7)in_stack_ffffffffffffffb8 >> 8);
        OVar10.Data4[2] = (char)((uint7)in_stack_ffffffffffffffb8 >> 0x10);
        OVar10.Data4[3] = (char)((uint7)in_stack_ffffffffffffffb8 >> 0x18);
        OVar10.Data4[4] = (char)((uint7)in_stack_ffffffffffffffb8 >> 0x20);
        OVar10.Data4[5] = (char)((uint7)in_stack_ffffffffffffffb8 >> 0x28);
        OVar10.Data4[6] = (char)((uint7)in_stack_ffffffffffffffb8 >> 0x30);
        OVar10.Data1 = 0x55ac73;
        OVar10.Data2 = 0;
        OVar10.Data3 = 0;
        OVar10.Data4[7] = in_stack_ffffffffffffffbf;
        pOVar3 = ClassId(OVar10);
        g_bDisableDemotion = 0;
        if (pOVar3 == (ON_ClassId *)0x0) {
          bVar1 = ON_UuidIsNil(&this->m_uuid);
          if (!bVar1) {
            ppOVar9 = &m_p0;
            pOVar3 = m_p0;
            if (m_p0 != (ON_ClassId *)0x0 && *pcVar6 != '\0') {
              do {
                if ((((pOVar3->m_pBaseClassId == (ON_ClassId *)0x0) &&
                     (pOVar3->m_sBaseClassName[0] != '\0')) &&
                    (pOVar3->m_sBaseClassName[0x4f] == '\0')) &&
                   (iVar2 = strcmp(pcVar6,pOVar3->m_sBaseClassName), iVar2 == 0)) {
                  pOVar3->m_pBaseClassId = this;
                }
                pOVar3 = pOVar3->m_pNext;
              } while (pOVar3 != (ON_ClassId *)0x0);
            }
            if (m_p1 != (ON_ClassId *)0x0 && m_p0 != (ON_ClassId *)0x0) {
              m_p1->m_pNext = this;
              ppOVar9 = &m_p1;
            }
            *ppOVar9 = this;
            m_p1 = this;
            this->m_pNext = (ON_ClassId *)0x0;
            return;
          }
          pcVar6 = "ON_ClassId::ON_ClassId() - class uuid is nill.";
          iVar2 = 0x31b;
        }
        else {
          pcVar6 = "ON_ClassId::ON_ClassId() - class uuid already in use.";
          iVar2 = 0x315;
        }
      }
      else {
        pcVar6 = "ON_ClassId::ON_ClassId() - missing baseclass name.";
        iVar2 = 0x30c;
      }
    }
    else {
      pcVar6 = "ON_ClassId::ON_ClassId() - class name already in use.";
      iVar2 = 0x2fc;
    }
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_object.cpp"
             ,iVar2,"",pcVar6);
  return;
}

Assistant:

void ON_ClassId::ConstructorHelper( const char* sClassName, 
                        const char* sBaseClassName, 
                        const char* sUUID // UUID in registry format from guidgen
                        ) 
{
  // Do not initialize "m_class_id_version" or any fields
  // after it in this helper.  See comments in the constructors
  // for more information.
  memset( m_sClassName, 0, sizeof(m_sClassName) );
  memset( m_sBaseClassName, 0, sizeof(m_sBaseClassName) );
  m_uuid = ON_UuidFromString(sUUID);
  if ( sClassName ) {
    strncpy( m_sClassName, sClassName, sizeof(m_sClassName)-1 );
  }
  if ( sBaseClassName ) {
    strncpy( m_sBaseClassName, sBaseClassName, sizeof(m_sBaseClassName)-1 );
  }
  m_pBaseClassId = ClassId( m_sBaseClassName );

  if ( !m_sClassName[0] ) {
    ON_ERROR("ON_ClassId::ON_ClassId() - missing class name");
    return;
  }

  const ON_ClassId* duplicate_class = ClassId( m_sClassName );
  // The m_mark0 > 2 test prevents opennurbs and Rhino from
  // having two ON_Object derived classes that have the same
  // name.  Plug-ins are free to use any name.
  if ( 0 != duplicate_class && m_mark0 > 2 )
  {
    char s[7];
    int ver;
    ON_WARNING("ON_ClassId::ON_ClassId() - class name already in use.  Will append number to make it unique.");
    for ( ver = 1; ver < 10000 && 0 != duplicate_class; ver++ )
    {
      IntToString(ver,s);
      s[6] = 0;
      strncpy( m_sClassName, sClassName, sizeof(m_sClassName)-1 );
      strncat( m_sClassName, s, sizeof(m_sClassName)-1 );
      duplicate_class = ClassId( m_sClassName );
    }
  }

  if ( 0 != duplicate_class )
  {
    // Do NOT permit core classes to have duplicate names.
    ON_ERROR("ON_ClassId::ON_ClassId() - class name already in use.");
    return;
  }

  if (    m_sClassName[0] != 'O'
       || m_sClassName[1] != 'N'
       || m_sClassName[2] != '_'
       || m_sClassName[3] != 'O'
       || m_sClassName[4] != 'b'
       || m_sClassName[5] != 'j'
       || m_sClassName[6] != 'e'
       || m_sClassName[7] != 'c'
       || m_sClassName[8] != 't'
       || m_sClassName[9] != 0 ) {
    if ( !m_sBaseClassName[0] ) 
    {
      ON_ERROR("ON_ClassId::ON_ClassId() - missing baseclass name.");
      return;
    }
  }

  g_bDisableDemotion = true;
  if ( ClassId( m_uuid ) ) 
  {
    g_bDisableDemotion = false;
    ON_ERROR("ON_ClassId::ON_ClassId() - class uuid already in use.");
    return;
  }
  g_bDisableDemotion = false;

  if ( ON_UuidIsNil( m_uuid ) ) {
    ON_ERROR("ON_ClassId::ON_ClassId() - class uuid is nill.");
    return;
  }

  // see if any derived classes need to be updated because their static
  // members got initialized first
  if ( m_sClassName[0] ) 
  {
    for ( ON_ClassId* p = m_p0; p; p = p->m_pNext )
    {
      if ( 
        0 == p->m_pBaseClassId 
        && 0 != p->m_sBaseClassName[0] 
        && 0 == p->m_sBaseClassName[sizeof(p->m_sBaseClassName)/sizeof(p->m_sBaseClassName[0]) - 1] 
        )
      {
        if ( 0 == strcmp( m_sClassName, p->m_sBaseClassName ) )
          p->m_pBaseClassId = this;
      }
    }
  }

  // Append to the list of class ids
  if ( m_p0 && m_p1 )
  {
    m_p1->m_pNext = this;
    m_p1 = this;
  }
  else
  {
    // first class id
    m_p0 = this;
  }
  m_p1 = this;
  m_p1->m_pNext = 0;
}